

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_rsassa_pss_verify_ext
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,
              mbedtls_md_type_t mgf1_hash_id,int expected_salt_len,uchar *sig)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  uchar *puVar6;
  uchar *input;
  bool bVar7;
  int local_4cc;
  undefined1 local_4c8 [8];
  mbedtls_md_context_t md_ctx;
  mbedtls_md_info_t *md_info;
  size_t msb;
  size_t slen;
  uchar local_490 [4];
  uint hlen;
  uchar zeros [8];
  uchar result [64];
  uchar buf [1024];
  uchar *p;
  size_t siglen;
  int ret;
  uint hashlen_local;
  mbedtls_md_type_t md_alg_local;
  int mode_local;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_rsa_context *ctx_local;
  
  if ((mode == 1) && (ctx->padding != 1)) {
    ctx_local._4_4_ = -0x4080;
  }
  else {
    puVar6 = (uchar *)ctx->len;
    if ((puVar6 < (uchar *)0x10) || ((uchar *)0x400 < puVar6)) {
      ctx_local._4_4_ = -0x4080;
    }
    else {
      if (mode == 0) {
        local_4cc = mbedtls_rsa_public(ctx,sig,result + 0x38);
      }
      else {
        local_4cc = mbedtls_rsa_private(ctx,f_rng,p_rng,sig,result + 0x38);
      }
      if (local_4cc == 0) {
        buf._1016_8_ = result + 0x38;
        if ((puVar6 + -0x449)[(long)&stack0x00000000] == 0xbc) {
          siglen._4_4_ = hashlen;
          if (md_alg != MBEDTLS_MD_NONE) {
            md_ctx.hmac_ctx = mbedtls_md_info_from_type(md_alg);
            if ((mbedtls_md_info_t *)md_ctx.hmac_ctx == (mbedtls_md_info_t *)0x0) {
              return -0x4080;
            }
            bVar2 = mbedtls_md_get_size((mbedtls_md_info_t *)md_ctx.hmac_ctx);
            siglen._4_4_ = (uint)bVar2;
          }
          md_ctx.hmac_ctx = mbedtls_md_info_from_type(mgf1_hash_id);
          if ((mbedtls_md_info_t *)md_ctx.hmac_ctx == (mbedtls_md_info_t *)0x0) {
            ctx_local._4_4_ = -0x4080;
          }
          else {
            bVar2 = mbedtls_md_get_size((mbedtls_md_info_t *)md_ctx.hmac_ctx);
            uVar3 = (uint)bVar2;
            memset(local_490,0,8);
            sVar5 = mbedtls_mpi_bitlen(&ctx->N);
            p = puVar6;
            if ((sVar5 - 1 & 7) == 0) {
              buf._1016_8_ = result + 0x39;
              p = puVar6 + -1;
            }
            cVar1 = (char)(sVar5 - 1);
            if ((int)(uint)result[0x38] >> (('\b' - (char)((long)p << 3)) + cVar1 & 0x1fU) == 0) {
              mbedtls_md_init((mbedtls_md_context_t *)local_4c8);
              mbedtls_md_setup((mbedtls_md_context_t *)local_4c8,
                               (mbedtls_md_info_t *)md_ctx.hmac_ctx,0);
              mgf_mask((uchar *)buf._1016_8_,(size_t)(p + (-1 - (ulong)uVar3)),
                       p + (buf._1016_8_ - (ulong)uVar3) + -1,(ulong)uVar3,
                       (mbedtls_md_context_t *)local_4c8);
              result[0x38] = result[0x38] & (byte)(0xff >> ((char)((long)p << 3) - cVar1 & 0x1fU));
              while( true ) {
                bVar7 = false;
                if ((ulong)buf._1016_8_ < result + 0x38 + (long)p) {
                  bVar7 = *(char *)buf._1016_8_ == '\0';
                }
                if (!bVar7) break;
                buf._1016_8_ = buf._1016_8_ + 1;
              }
              if (((uchar *)buf._1016_8_ == result + 0x38 + (long)p) ||
                 (input = (uchar *)(buf._1016_8_ + 1), *(char *)buf._1016_8_ != '\x01')) {
                mbedtls_md_free((mbedtls_md_context_t *)local_4c8);
                ctx_local._4_4_ = -0x4100;
              }
              else {
                puVar6 = puVar6 + ((-1 - (ulong)uVar3) - ((long)input - (long)(result + 0x38)));
                if ((expected_salt_len == -1) || (puVar6 == (uchar *)(long)expected_salt_len)) {
                  mbedtls_md_starts((mbedtls_md_context_t *)local_4c8);
                  mbedtls_md_update((mbedtls_md_context_t *)local_4c8,local_490,8);
                  mbedtls_md_update((mbedtls_md_context_t *)local_4c8,hash,(ulong)siglen._4_4_);
                  mbedtls_md_update((mbedtls_md_context_t *)local_4c8,input,(size_t)puVar6);
                  mbedtls_md_finish((mbedtls_md_context_t *)local_4c8,zeros);
                  mbedtls_md_free((mbedtls_md_context_t *)local_4c8);
                  iVar4 = memcmp(input + (long)puVar6,zeros,(ulong)uVar3);
                  if (iVar4 == 0) {
                    ctx_local._4_4_ = 0;
                  }
                  else {
                    ctx_local._4_4_ = -0x4380;
                  }
                }
                else {
                  mbedtls_md_free((mbedtls_md_context_t *)local_4c8);
                  ctx_local._4_4_ = -0x4100;
                }
              }
            }
            else {
              ctx_local._4_4_ = -0x4080;
            }
          }
        }
        else {
          ctx_local._4_4_ = -0x4100;
        }
      }
      else {
        ctx_local._4_4_ = local_4cc;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_rsa_rsassa_pss_verify_ext( mbedtls_rsa_context *ctx,
                               int (*f_rng)(void *, unsigned char *, size_t),
                               void *p_rng,
                               int mode,
                               mbedtls_md_type_t md_alg,
                               unsigned int hashlen,
                               const unsigned char *hash,
                               mbedtls_md_type_t mgf1_hash_id,
                               int expected_salt_len,
                               const unsigned char *sig )
{
    int ret;
    size_t siglen;
    unsigned char *p;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];
    unsigned char result[MBEDTLS_MD_MAX_SIZE];
    unsigned char zeros[8];
    unsigned int hlen;
    size_t slen, msb;
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V21 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    siglen = ctx->len;

    if( siglen < 16 || siglen > sizeof( buf ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    ret = ( mode == MBEDTLS_RSA_PUBLIC )
          ? mbedtls_rsa_public(  ctx, sig, buf )
          : mbedtls_rsa_private( ctx, f_rng, p_rng, sig, buf );

    if( ret != 0 )
        return( ret );

    p = buf;

    if( buf[siglen - 1] != 0xBC )
        return( MBEDTLS_ERR_RSA_INVALID_PADDING );

    if( md_alg != MBEDTLS_MD_NONE )
    {
        // Gather length of hash to sign
        //
        md_info = mbedtls_md_info_from_type( md_alg );
        if( md_info == NULL )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        hashlen = mbedtls_md_get_size( md_info );
    }

    md_info = mbedtls_md_info_from_type( mgf1_hash_id );
    if( md_info == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    hlen = mbedtls_md_get_size( md_info );
    slen = siglen - hlen - 1; /* Currently length of salt + padding */

    memset( zeros, 0, 8 );

    // Note: EMSA-PSS verification is over the length of N - 1 bits
    //
    msb = mbedtls_mpi_bitlen( &ctx->N ) - 1;

    // Compensate for boundary condition when applying mask
    //
    if( msb % 8 == 0 )
    {
        p++;
        siglen -= 1;
    }
    if( buf[0] >> ( 8 - siglen * 8 + msb ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    mbedtls_md_init( &md_ctx );
    mbedtls_md_setup( &md_ctx, md_info, 0 );

    mgf_mask( p, siglen - hlen - 1, p + siglen - hlen - 1, hlen, &md_ctx );

    buf[0] &= 0xFF >> ( siglen * 8 - msb );

    while( p < buf + siglen && *p == 0 )
        p++;

    if( p == buf + siglen ||
        *p++ != 0x01 )
    {
        mbedtls_md_free( &md_ctx );
        return( MBEDTLS_ERR_RSA_INVALID_PADDING );
    }

    /* Actual salt len */
    slen -= p - buf;

    if( expected_salt_len != MBEDTLS_RSA_SALT_LEN_ANY &&
        slen != (size_t) expected_salt_len )
    {
        mbedtls_md_free( &md_ctx );
        return( MBEDTLS_ERR_RSA_INVALID_PADDING );
    }

    // Generate H = Hash( M' )
    //
    mbedtls_md_starts( &md_ctx );
    mbedtls_md_update( &md_ctx, zeros, 8 );
    mbedtls_md_update( &md_ctx, hash, hashlen );
    mbedtls_md_update( &md_ctx, p, slen );
    mbedtls_md_finish( &md_ctx, result );

    mbedtls_md_free( &md_ctx );

    if( memcmp( p + slen, result, hlen ) == 0 )
        return( 0 );
    else
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );
}